

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O2

void __thiscall
SuiteMessageTests::TestheaderFieldsFirst::TestheaderFieldsFirst(TestheaderFieldsFirst *this)

{
  UnitTest::Test::Test
            (&this->super_Test,"headerFieldsFirst","MessageTests",
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/MessagesTestCase.cpp"
             ,0x17a);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0031ded0;
  return;
}

Assistant:

TEST(headerFieldsFirst)
{
  FIX::Message object;
  const std::string str =
    "8=FIX.4.2\0019=95\00135=D\00134=5\00149=ISLD\00155=INTC\001"
    "52=00000000-00:00:00\00156=TW\00111=ID\00121=3\001"
    "40=1\00154=1\00160=00000000-00:00:00\00110=000\001";
  object.setString( str, false );
  int field = 0;
  CHECK( !object.hasValidStructure(field) );
  CHECK_EQUAL( 52, field );
}